

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O2

void ncnn::pack_B_tile_fp32_to_int8_avx2
               (Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk,float scale)

{
  float *pfVar1;
  void *pvVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  long lVar6;
  long lVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  long lVar17;
  long lVar18;
  int kk;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  undefined1 (*pauVar23) [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  __m128i _vindex;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar64 [32];
  undefined1 auVar61 [16];
  undefined1 auVar66 [32];
  undefined1 auVar62 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar73;
  undefined1 auVar77 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 in_ZMM11 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar86 [32];
  size_t *psVar7;
  undefined1 auVar55 [64];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  
  iVar5 = cpu_support_x86_avx_vnni_int8();
  if (iVar5 != 0) {
    pack_B_tile_fp32_to_int8_avxvnniint8(B,BT,j,max_jj,k,max_kk,scale);
    return;
  }
  iVar5 = cpu_support_x86_avx_vnni();
  auVar27 = _DAT_00543080;
  auVar26 = _DAT_00543070;
  if (iVar5 == 0) {
    iVar5 = B->elempack;
    psVar7 = (size_t *)&B->w;
    if (B->dims == 3) {
      psVar7 = &B->cstep;
    }
    iVar20 = (int)*psVar7;
    lVar6 = (long)iVar20;
    pauVar16 = (undefined1 (*) [16])BT->data;
    lVar21 = (long)(iVar5 * k);
    lVar12 = (long)(iVar20 * 4);
    auVar86._4_4_ = iVar20;
    auVar86._0_4_ = iVar20;
    auVar86._8_4_ = iVar20;
    auVar86._12_4_ = iVar20;
    auVar86._16_4_ = iVar20;
    auVar86._20_4_ = iVar20;
    auVar86._24_4_ = iVar20;
    auVar86._28_4_ = iVar20;
    vpmulld_avx2(auVar86,_DAT_00539780);
    lVar14 = (long)j;
    lVar8 = (long)max_jj;
    lVar17 = (long)k;
    lVar13 = lVar17 * 4 + lVar6 * lVar14 * 4;
    lVar11 = lVar6 * 0x20;
    lVar18 = (lVar14 * 4 + 4) * lVar6 + lVar17 * 4;
    lVar22 = lVar21 * 4 + lVar6 * lVar14 * 4;
    auVar29._8_4_ = 0x80000000;
    auVar29._0_8_ = 0x8000000080000000;
    auVar29._12_4_ = 0x80000000;
    auVar29._16_4_ = 0x80000000;
    auVar29._20_4_ = 0x80000000;
    auVar29._24_4_ = 0x80000000;
    auVar29._28_4_ = 0x80000000;
    auVar32._8_4_ = 0x3f000000;
    auVar32._0_8_ = 0x3f0000003f000000;
    auVar32._12_4_ = 0x3f000000;
    auVar32._16_4_ = 0x3f000000;
    auVar32._20_4_ = 0x3f000000;
    auVar32._24_4_ = 0x3f000000;
    auVar32._28_4_ = 0x3f000000;
    auVar44._8_2_ = 0x7f;
    auVar44._0_8_ = 0x7f007f007f007f;
    auVar44._10_2_ = 0x7f;
    auVar44._12_2_ = 0x7f;
    auVar44._14_2_ = 0x7f;
    auVar44._16_2_ = 0x7f;
    auVar44._18_2_ = 0x7f;
    auVar44._20_2_ = 0x7f;
    auVar44._22_2_ = 0x7f;
    auVar44._24_2_ = 0x7f;
    auVar44._26_2_ = 0x7f;
    auVar44._28_2_ = 0x7f;
    auVar44._30_2_ = 0x7f;
    auVar54._8_2_ = 0xff81;
    auVar54._0_8_ = 0xff81ff81ff81ff81;
    auVar54._10_2_ = 0xff81;
    auVar54._12_2_ = 0xff81;
    auVar54._14_2_ = 0xff81;
    auVar54._16_2_ = 0xff81;
    auVar54._18_2_ = 0xff81;
    auVar54._20_2_ = 0xff81;
    auVar54._22_2_ = 0xff81;
    auVar54._24_2_ = 0xff81;
    auVar54._26_2_ = 0xff81;
    auVar54._28_2_ = 0xff81;
    auVar54._30_2_ = 0xff81;
    auVar55 = ZEXT3264(auVar54);
    auVar24._8_2_ = 0x7f;
    auVar24._0_8_ = 0x7f007f007f007f;
    auVar24._10_2_ = 0x7f;
    auVar24._12_2_ = 0x7f;
    auVar24._14_2_ = 0x7f;
    auVar59 = ZEXT1664(_DAT_00543070);
    auVar25._8_2_ = 0xff81;
    auVar25._0_8_ = 0xff81ff81ff81ff81;
    auVar25._10_2_ = 0xff81;
    auVar25._12_2_ = 0xff81;
    auVar25._14_2_ = 0xff81;
    for (uVar15 = 0; pvVar2 = B->data, (long)(uVar15 | 7) < lVar8; uVar15 = uVar15 + 8) {
      pfVar10 = (float *)((long)pvVar2 + lVar21 * 4 + (lVar14 + uVar15) * lVar6 * 4);
      if (iVar5 == 8) {
        lVar9 = 0;
        for (iVar19 = 0; iVar19 + 1 < max_kk; iVar19 = iVar19 + 2) {
          pfVar1 = (float *)((long)pvVar2 + lVar9 * 4 + lVar22);
          auVar68._0_4_ = scale * *pfVar1;
          auVar68._4_4_ = scale * pfVar1[1];
          auVar68._8_4_ = scale * pfVar1[2];
          auVar68._12_4_ = scale * pfVar1[3];
          auVar68._16_4_ = scale * pfVar1[4];
          auVar68._20_4_ = scale * pfVar1[5];
          auVar68._28_36_ = in_ZMM10._28_36_;
          auVar68._24_4_ = scale * pfVar1[6];
          pfVar1 = (float *)((long)pvVar2 + lVar9 * 4 + lVar22 + 0x20);
          auVar78._0_4_ = scale * *pfVar1;
          auVar78._4_4_ = scale * pfVar1[1];
          auVar78._8_4_ = scale * pfVar1[2];
          auVar78._12_4_ = scale * pfVar1[3];
          auVar78._16_4_ = scale * pfVar1[4];
          auVar78._20_4_ = scale * pfVar1[5];
          auVar78._28_36_ = in_ZMM11._28_36_;
          auVar78._24_4_ = scale * pfVar1[6];
          auVar86 = vandps_avx(auVar68._0_32_,auVar29);
          auVar63 = vandps_avx(auVar78._0_32_,auVar29);
          auVar86 = vorps_avx(auVar86,auVar32);
          auVar63 = vorps_avx(auVar63,auVar32);
          auVar76._0_4_ = (int)(auVar68._0_4_ + auVar86._0_4_);
          auVar76._4_4_ = (int)(auVar68._4_4_ + auVar86._4_4_);
          auVar76._8_4_ = (int)(auVar68._8_4_ + auVar86._8_4_);
          auVar76._12_4_ = (int)(auVar68._12_4_ + auVar86._12_4_);
          auVar76._16_4_ = (int)(auVar68._16_4_ + auVar86._16_4_);
          auVar76._20_4_ = (int)(auVar68._20_4_ + auVar86._20_4_);
          auVar76._24_4_ = (int)(auVar68._24_4_ + auVar86._24_4_);
          auVar76._28_4_ = (int)(in_ZMM10._28_4_ + auVar86._28_4_);
          auVar74._0_4_ = (int)(auVar78._0_4_ + auVar63._0_4_);
          auVar74._4_4_ = (int)(auVar78._4_4_ + auVar63._4_4_);
          auVar74._8_4_ = (int)(auVar78._8_4_ + auVar63._8_4_);
          auVar74._12_4_ = (int)(auVar78._12_4_ + auVar63._12_4_);
          auVar74._16_4_ = (int)(auVar78._16_4_ + auVar63._16_4_);
          auVar74._20_4_ = (int)(auVar78._20_4_ + auVar63._20_4_);
          auVar74._24_4_ = (int)(auVar78._24_4_ + auVar63._24_4_);
          auVar74._28_4_ = (int)(in_ZMM11._28_4_ + auVar63._28_4_);
          auVar86 = vpackssdw_avx2(auVar76,auVar74);
          auVar86 = vpermq_avx2(auVar86,0xd8);
          auVar86 = vpminsw_avx2(auVar86,auVar44);
          auVar86 = vpmaxsw_avx2(auVar86,auVar54);
          in_ZMM11 = ZEXT1664(auVar86._16_16_);
          auVar60 = vpacksswb_avx(auVar86._0_16_,auVar86._16_16_);
          auVar60 = vpshufb_avx(auVar60,auVar26);
          in_ZMM10 = ZEXT1664(auVar60);
          *(undefined1 (*) [16])(*pauVar16 + lVar9) = auVar60;
          pfVar10 = pfVar10 + 0x10;
          lVar9 = lVar9 + 0x10;
        }
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + lVar9);
        for (; iVar19 < max_kk; iVar19 = iVar19 + 1) {
          auVar69._0_4_ = scale * *pfVar10;
          auVar69._4_4_ = scale * pfVar10[1];
          auVar69._8_4_ = scale * pfVar10[2];
          auVar69._12_4_ = scale * pfVar10[3];
          auVar69._16_4_ = scale * pfVar10[4];
          auVar69._20_4_ = scale * pfVar10[5];
          auVar69._28_36_ = in_ZMM10._28_36_;
          auVar69._24_4_ = scale * pfVar10[6];
          auVar86 = vandps_avx(auVar69._0_32_,auVar29);
          auVar86 = vorps_avx(auVar86,auVar32);
          auVar60._0_4_ = (int)(auVar69._0_4_ + auVar86._0_4_);
          auVar60._4_4_ = (int)(auVar69._4_4_ + auVar86._4_4_);
          auVar60._8_4_ = (int)(auVar69._8_4_ + auVar86._8_4_);
          auVar60._12_4_ = (int)(auVar69._12_4_ + auVar86._12_4_);
          auVar63._16_4_ = (int)(auVar69._16_4_ + auVar86._16_4_);
          auVar63._0_16_ = auVar60;
          auVar63._20_4_ = (int)(auVar69._20_4_ + auVar86._20_4_);
          auVar63._24_4_ = (int)(auVar69._24_4_ + auVar86._24_4_);
          auVar63._28_4_ = (int)(in_ZMM10._28_4_ + auVar86._28_4_);
          in_ZMM11 = ZEXT1664(auVar63._16_16_);
          auVar60 = vpackssdw_avx(auVar60,auVar63._16_16_);
          auVar60 = vpminsw_avx(auVar60,auVar24);
          auVar60 = vpmaxsw_avx(auVar60,auVar25);
          auVar60 = vpacksswb_avx(auVar60,auVar60);
          in_ZMM10 = ZEXT1664(auVar60);
          *(long *)*pauVar16 = auVar60._0_8_;
          pauVar16 = (undefined1 (*) [16])(*pauVar16 + 8);
          pfVar10 = pfVar10 + 8;
        }
      }
      if (iVar5 == 4) {
        for (iVar19 = 0; iVar19 + 1 < max_kk; iVar19 = iVar19 + 2) {
          auVar70._0_4_ = scale * *pfVar10;
          auVar70._4_4_ = scale * pfVar10[1];
          auVar70._8_4_ = scale * pfVar10[2];
          auVar70._12_4_ = scale * pfVar10[3];
          auVar70._16_4_ = scale * pfVar10[4];
          auVar70._20_4_ = scale * pfVar10[5];
          auVar70._28_36_ = in_ZMM10._28_36_;
          auVar70._24_4_ = scale * pfVar10[6];
          pfVar1 = pfVar10 + lVar12;
          auVar79._0_4_ = scale * *pfVar1;
          auVar79._4_4_ = scale * pfVar1[1];
          auVar79._8_4_ = scale * pfVar1[2];
          auVar79._12_4_ = scale * pfVar1[3];
          auVar79._16_4_ = scale * pfVar1[4];
          auVar79._20_4_ = scale * pfVar1[5];
          auVar79._28_36_ = in_ZMM11._28_36_;
          auVar79._24_4_ = scale * pfVar1[6];
          auVar86 = vandps_avx(auVar70._0_32_,auVar29);
          auVar63 = vandps_avx(auVar79._0_32_,auVar29);
          auVar86 = vorps_avx(auVar86,auVar32);
          auVar63 = vorps_avx(auVar63,auVar32);
          auVar64._0_4_ = (int)(auVar70._0_4_ + auVar86._0_4_);
          auVar64._4_4_ = (int)(auVar70._4_4_ + auVar86._4_4_);
          auVar64._8_4_ = (int)(auVar70._8_4_ + auVar86._8_4_);
          auVar64._12_4_ = (int)(auVar70._12_4_ + auVar86._12_4_);
          auVar64._16_4_ = (int)(auVar70._16_4_ + auVar86._16_4_);
          auVar64._20_4_ = (int)(auVar70._20_4_ + auVar86._20_4_);
          auVar64._24_4_ = (int)(auVar70._24_4_ + auVar86._24_4_);
          auVar64._28_4_ = (int)(in_ZMM10._28_4_ + auVar86._28_4_);
          auVar75._0_4_ = (int)(auVar79._0_4_ + auVar63._0_4_);
          auVar75._4_4_ = (int)(auVar79._4_4_ + auVar63._4_4_);
          auVar75._8_4_ = (int)(auVar79._8_4_ + auVar63._8_4_);
          auVar75._12_4_ = (int)(auVar79._12_4_ + auVar63._12_4_);
          auVar75._16_4_ = (int)(auVar79._16_4_ + auVar63._16_4_);
          auVar75._20_4_ = (int)(auVar79._20_4_ + auVar63._20_4_);
          auVar75._24_4_ = (int)(auVar79._24_4_ + auVar63._24_4_);
          auVar75._28_4_ = (int)(in_ZMM11._28_4_ + auVar63._28_4_);
          auVar86 = vpackssdw_avx2(auVar64,auVar75);
          auVar86 = vpermq_avx2(auVar86,0xd8);
          auVar86 = vpminsw_avx2(auVar86,auVar44);
          auVar86 = vpmaxsw_avx2(auVar86,auVar54);
          in_ZMM11 = ZEXT1664(auVar86._16_16_);
          auVar60 = vpacksswb_avx(auVar86._0_16_,auVar86._16_16_);
          auVar60 = vpshufb_avx(auVar60,auVar27);
          in_ZMM10 = ZEXT1664(auVar60);
          *pauVar16 = auVar60;
          pauVar16 = pauVar16 + 1;
          pfVar10 = pfVar10 + 8;
        }
        for (; iVar19 < max_kk; iVar19 = iVar19 + 1) {
          auVar3._4_4_ = pfVar10[1] * scale;
          auVar3._0_4_ = *pfVar10 * scale;
          auVar3._8_4_ = pfVar10[2] * scale;
          auVar3._12_4_ = pfVar10[3] * scale;
          auVar3._16_4_ = pfVar10[lVar12 + 4] * scale;
          auVar3._20_4_ = pfVar10[lVar12 + 5] * scale;
          auVar3._24_4_ = pfVar10[lVar12 + 6] * scale;
          auVar3._28_4_ = pfVar10[lVar12 + 7];
          auVar86 = vandps_avx(auVar3,auVar29);
          auVar86 = vorps_avx(auVar86,auVar32);
          auVar61._0_4_ = (int)(*pfVar10 * scale + auVar86._0_4_);
          auVar61._4_4_ = (int)(pfVar10[1] * scale + auVar86._4_4_);
          auVar61._8_4_ = (int)(pfVar10[2] * scale + auVar86._8_4_);
          auVar61._12_4_ = (int)(pfVar10[3] * scale + auVar86._12_4_);
          auVar65._16_4_ = (int)(pfVar10[lVar12 + 4] * scale + auVar86._16_4_);
          auVar65._0_16_ = auVar61;
          auVar65._20_4_ = (int)(pfVar10[lVar12 + 5] * scale + auVar86._20_4_);
          auVar65._24_4_ = (int)(pfVar10[lVar12 + 6] * scale + auVar86._24_4_);
          auVar65._28_4_ = (int)(pfVar10[lVar12 + 7] + auVar86._28_4_);
          in_ZMM11 = ZEXT1664(auVar65._16_16_);
          auVar60 = vpackssdw_avx(auVar61,auVar65._16_16_);
          auVar60 = vpminsw_avx(auVar60,auVar24);
          auVar60 = vpmaxsw_avx(auVar60,auVar25);
          auVar60 = vpacksswb_avx(auVar60,auVar60);
          in_ZMM10 = ZEXT1664(auVar60);
          *(long *)*pauVar16 = auVar60._0_8_;
          pauVar16 = (undefined1 (*) [16])(*pauVar16 + 8);
          pfVar10 = pfVar10 + 4;
        }
      }
      if (iVar5 == 1) {
        for (iVar19 = 0; iVar19 + 1 < max_kk; iVar19 = iVar19 + 2) {
          auVar86 = vpcmpeqd_avx2(in_ZMM10._0_32_,in_ZMM10._0_32_);
          auVar76 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar86);
          auVar86 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
          auVar86 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar86);
          auVar71._0_4_ = auVar76._0_4_ * scale;
          auVar71._4_4_ = auVar76._4_4_ * scale;
          auVar71._8_4_ = auVar76._8_4_ * scale;
          auVar71._12_4_ = auVar76._12_4_ * scale;
          auVar71._16_4_ = auVar76._16_4_ * scale;
          auVar71._20_4_ = auVar76._20_4_ * scale;
          auVar71._28_36_ = SUB6436(ZEXT3264((undefined1  [32])0x0),0x1c);
          auVar71._24_4_ = auVar76._24_4_ * scale;
          fVar73 = auVar86._0_4_ * scale;
          fVar80 = auVar86._4_4_ * scale;
          auVar4._4_4_ = fVar80;
          auVar4._0_4_ = fVar73;
          fVar81 = auVar86._8_4_ * scale;
          auVar4._8_4_ = fVar81;
          fVar82 = auVar86._12_4_ * scale;
          auVar4._12_4_ = fVar82;
          fVar83 = auVar86._16_4_ * scale;
          auVar4._16_4_ = fVar83;
          fVar84 = auVar86._20_4_ * scale;
          auVar4._20_4_ = fVar84;
          fVar85 = auVar86._24_4_ * scale;
          auVar4._24_4_ = fVar85;
          auVar4._28_4_ = auVar76._28_4_;
          auVar86 = vandps_avx(auVar71._0_32_,auVar29);
          auVar63 = vandps_avx(auVar4,auVar29);
          auVar86 = vorps_avx(auVar86,auVar32);
          auVar63 = vorps_avx(auVar63,auVar32);
          auVar66._0_4_ = (int)(auVar71._0_4_ + auVar86._0_4_);
          auVar66._4_4_ = (int)(auVar71._4_4_ + auVar86._4_4_);
          auVar66._8_4_ = (int)(auVar71._8_4_ + auVar86._8_4_);
          auVar66._12_4_ = (int)(auVar71._12_4_ + auVar86._12_4_);
          auVar66._16_4_ = (int)(auVar71._16_4_ + auVar86._16_4_);
          auVar66._20_4_ = (int)(auVar71._20_4_ + auVar86._20_4_);
          auVar66._24_4_ = (int)(auVar71._24_4_ + auVar86._24_4_);
          auVar66._28_4_ = (int)(SUB644(ZEXT3264((undefined1  [32])0x0),0x1c) + auVar86._28_4_);
          auVar77._0_4_ = (int)(fVar73 + auVar63._0_4_);
          auVar77._4_4_ = (int)(fVar80 + auVar63._4_4_);
          auVar77._8_4_ = (int)(fVar81 + auVar63._8_4_);
          auVar77._12_4_ = (int)(fVar82 + auVar63._12_4_);
          auVar77._16_4_ = (int)(fVar83 + auVar63._16_4_);
          auVar77._20_4_ = (int)(fVar84 + auVar63._20_4_);
          auVar77._24_4_ = (int)(fVar85 + auVar63._24_4_);
          auVar77._28_4_ = (int)(auVar76._28_4_ + auVar63._28_4_);
          auVar86 = vpackssdw_avx2(auVar66,auVar77);
          auVar86 = vpermq_avx2(auVar86,0xd8);
          auVar86 = vpminsw_avx2(auVar86,auVar44);
          auVar86 = vpmaxsw_avx2(auVar86,auVar54);
          in_ZMM11 = ZEXT1664(auVar86._16_16_);
          auVar60 = vpacksswb_avx(auVar86._0_16_,auVar86._16_16_);
          auVar60 = vpshufb_avx(auVar60,auVar26);
          in_ZMM10 = ZEXT1664(auVar60);
          *pauVar16 = auVar60;
          pauVar16 = pauVar16 + 1;
        }
        for (; iVar19 < max_kk; iVar19 = iVar19 + 1) {
          auVar86 = vpcmpeqd_avx2(in_ZMM10._0_32_,in_ZMM10._0_32_);
          auVar86 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar86);
          auVar72._0_4_ = auVar86._0_4_ * scale;
          auVar72._4_4_ = auVar86._4_4_ * scale;
          auVar72._8_4_ = auVar86._8_4_ * scale;
          auVar72._12_4_ = auVar86._12_4_ * scale;
          auVar72._16_4_ = auVar86._16_4_ * scale;
          auVar72._20_4_ = auVar86._20_4_ * scale;
          auVar72._28_36_ = SUB6436(ZEXT3264((undefined1  [32])0x0),0x1c);
          auVar72._24_4_ = auVar86._24_4_ * scale;
          auVar86 = vandps_avx(auVar72._0_32_,auVar29);
          auVar86 = vorps_avx(auVar86,auVar32);
          auVar62._0_4_ = (int)(auVar72._0_4_ + auVar86._0_4_);
          auVar62._4_4_ = (int)(auVar72._4_4_ + auVar86._4_4_);
          auVar62._8_4_ = (int)(auVar72._8_4_ + auVar86._8_4_);
          auVar62._12_4_ = (int)(auVar72._12_4_ + auVar86._12_4_);
          auVar67._16_4_ = (int)(auVar72._16_4_ + auVar86._16_4_);
          auVar67._0_16_ = auVar62;
          auVar67._20_4_ = (int)(auVar72._20_4_ + auVar86._20_4_);
          auVar67._24_4_ = (int)(auVar72._24_4_ + auVar86._24_4_);
          auVar67._28_4_ = (int)(SUB644(ZEXT3264((undefined1  [32])0x0),0x1c) + auVar86._28_4_);
          in_ZMM11 = ZEXT1664(auVar67._16_16_);
          auVar60 = vpackssdw_avx(auVar62,auVar67._16_16_);
          auVar60 = vpminsw_avx(auVar60,auVar24);
          auVar60 = vpmaxsw_avx(auVar60,auVar25);
          auVar60 = vpacksswb_avx(auVar60,auVar60);
          in_ZMM10 = ZEXT1664(auVar60);
          *(long *)*pauVar16 = auVar60._0_8_;
          pauVar16 = (undefined1 (*) [16])(*pauVar16 + 8);
        }
      }
      lVar13 = lVar13 + lVar11;
      lVar18 = lVar18 + lVar11;
      lVar22 = lVar22 + lVar11;
    }
    auVar26._4_4_ = iVar20;
    auVar26._0_4_ = iVar20;
    auVar26._8_4_ = iVar20;
    auVar26._12_4_ = iVar20;
    vpmulld_avx(auVar26,_DAT_00538410);
    lVar11 = lVar6 * 0x10;
    lVar22 = lVar22 + (long)pvVar2;
    auVar27._8_4_ = 0x80000000;
    auVar27._0_8_ = 0x8000000080000000;
    auVar27._12_4_ = 0x80000000;
    auVar28._8_4_ = 0x3f000000;
    auVar28._0_8_ = 0x3f0000003f000000;
    auVar28._12_4_ = 0x3f000000;
    for (; (long)(uVar15 | 3) < lVar8; uVar15 = uVar15 + 4) {
      pfVar10 = (float *)((long)pvVar2 + (lVar14 + uVar15) * lVar6 * 4 + lVar21 * 4);
      if (iVar5 == 4) {
        lVar12 = 0;
        for (iVar20 = 0; iVar20 + 1 < max_kk; iVar20 = iVar20 + 2) {
          pfVar1 = (float *)(lVar22 + lVar12 * 4);
          auVar33._0_4_ = scale * *pfVar1;
          auVar33._4_4_ = scale * pfVar1[1];
          auVar33._8_4_ = scale * pfVar1[2];
          auVar33._12_4_ = scale * pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x10 + lVar12 * 4);
          auVar45._0_4_ = scale * *pfVar1;
          auVar45._4_4_ = scale * pfVar1[1];
          auVar45._8_4_ = scale * pfVar1[2];
          auVar45._12_4_ = scale * pfVar1[3];
          auVar62 = vunpcklps_avx(auVar33,auVar45);
          auVar59 = ZEXT1664(auVar62);
          auVar61 = vunpckhps_avx(auVar33,auVar45);
          auVar26 = vandps_avx(auVar62,auVar27);
          auVar60 = vandps_avx(auVar61,auVar27);
          auVar26 = vorps_avx(auVar26,auVar28);
          auVar60 = vorps_avx(auVar60,auVar28);
          auVar46._0_4_ = (int)(auVar62._0_4_ + auVar26._0_4_);
          auVar46._4_4_ = (int)(auVar62._4_4_ + auVar26._4_4_);
          auVar46._8_4_ = (int)(auVar62._8_4_ + auVar26._8_4_);
          auVar46._12_4_ = (int)(auVar62._12_4_ + auVar26._12_4_);
          auVar55 = ZEXT1664(auVar46);
          auVar34._0_4_ = (int)(auVar60._0_4_ + auVar61._0_4_);
          auVar34._4_4_ = (int)(auVar60._4_4_ + auVar61._4_4_);
          auVar34._8_4_ = (int)(auVar60._8_4_ + auVar61._8_4_);
          auVar34._12_4_ = (int)(auVar60._12_4_ + auVar61._12_4_);
          auVar26 = vpackssdw_avx(auVar46,auVar34);
          auVar26 = vpminsw_avx(auVar26,auVar24);
          auVar26 = vpmaxsw_avx(auVar26,auVar25);
          auVar26 = vpacksswb_avx(auVar26,auVar26);
          *(long *)(*pauVar16 + lVar12) = auVar26._0_8_;
          pfVar10 = pfVar10 + 8;
          lVar12 = lVar12 + 8;
        }
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + lVar12);
        for (; iVar20 < max_kk; iVar20 = iVar20 + 1) {
          auVar35._0_4_ = scale * *pfVar10;
          auVar35._4_4_ = scale * pfVar10[1];
          auVar35._8_4_ = scale * pfVar10[2];
          auVar35._12_4_ = scale * pfVar10[3];
          auVar26 = vandps_avx(auVar35,auVar27);
          auVar26 = vorps_avx(auVar26,auVar28);
          auVar55 = ZEXT1664(auVar26);
          auVar36._0_4_ = (int)(auVar35._0_4_ + auVar26._0_4_);
          auVar36._4_4_ = (int)(auVar35._4_4_ + auVar26._4_4_);
          auVar36._8_4_ = (int)(auVar35._8_4_ + auVar26._8_4_);
          auVar36._12_4_ = (int)(auVar35._12_4_ + auVar26._12_4_);
          auVar26 = vpackssdw_avx(auVar36,auVar36);
          auVar26 = vpminsw_avx(auVar26,auVar24);
          auVar26 = vpmaxsw_avx(auVar26,auVar25);
          auVar26 = vpacksswb_avx(auVar26,auVar26);
          *(int *)*pauVar16 = auVar26._0_4_;
          pauVar16 = (undefined1 (*) [16])(*pauVar16 + 4);
          pfVar10 = pfVar10 + 4;
        }
      }
      if (iVar5 == 1) {
        for (iVar20 = 0; iVar20 + 1 < max_kk; iVar20 = iVar20 + 2) {
          auVar26 = vpcmpeqd_avx(auVar55._0_16_,auVar55._0_16_);
          auVar61 = vgatherdps((undefined1  [16])0x0,auVar26);
          auVar26 = vpcmpeqd_avx(auVar59._0_16_,auVar59._0_16_);
          auVar26 = vgatherdps((undefined1  [16])0x0,auVar26);
          auVar60 = vunpcklps_avx(auVar61,auVar26);
          auVar26 = vunpckhps_avx(auVar61,auVar26);
          auVar47._0_4_ = auVar60._0_4_ * scale;
          auVar47._4_4_ = auVar60._4_4_ * scale;
          auVar47._8_4_ = auVar60._8_4_ * scale;
          auVar47._12_4_ = auVar60._12_4_ * scale;
          auVar37._0_4_ = auVar26._0_4_ * scale;
          auVar37._4_4_ = auVar26._4_4_ * scale;
          auVar37._8_4_ = auVar26._8_4_ * scale;
          auVar37._12_4_ = auVar26._12_4_ * scale;
          auVar26 = vandps_avx(auVar47,auVar27);
          auVar60 = vandps_avx(auVar37,auVar27);
          auVar26 = vorps_avx(auVar26,auVar28);
          auVar59 = ZEXT1664(auVar26);
          auVar60 = vorps_avx(auVar60,auVar28);
          auVar48._0_4_ = (int)(auVar26._0_4_ + auVar47._0_4_);
          auVar48._4_4_ = (int)(auVar26._4_4_ + auVar47._4_4_);
          auVar48._8_4_ = (int)(auVar26._8_4_ + auVar47._8_4_);
          auVar48._12_4_ = (int)(auVar26._12_4_ + auVar47._12_4_);
          auVar55 = ZEXT1664(auVar48);
          auVar38._0_4_ = (int)(auVar60._0_4_ + auVar37._0_4_);
          auVar38._4_4_ = (int)(auVar60._4_4_ + auVar37._4_4_);
          auVar38._8_4_ = (int)(auVar60._8_4_ + auVar37._8_4_);
          auVar38._12_4_ = (int)(auVar60._12_4_ + auVar37._12_4_);
          auVar26 = vpackssdw_avx(auVar48,auVar38);
          auVar26 = vpminsw_avx(auVar26,auVar24);
          auVar26 = vpmaxsw_avx(auVar26,auVar25);
          auVar26 = vpacksswb_avx(auVar26,auVar26);
          *(long *)*pauVar16 = auVar26._0_8_;
          pauVar16 = (undefined1 (*) [16])(*pauVar16 + 8);
        }
        for (; iVar20 < max_kk; iVar20 = iVar20 + 1) {
          auVar26 = vpcmpeqd_avx(auVar55._0_16_,auVar55._0_16_);
          auVar26 = vgatherdps((undefined1  [16])0x0,auVar26);
          auVar39._0_4_ = auVar26._0_4_ * scale;
          auVar39._4_4_ = auVar26._4_4_ * scale;
          auVar39._8_4_ = auVar26._8_4_ * scale;
          auVar39._12_4_ = auVar26._12_4_ * scale;
          auVar26 = vandps_avx(auVar39,auVar27);
          auVar26 = vorps_avx(auVar26,auVar28);
          auVar55 = ZEXT1664(auVar26);
          auVar40._0_4_ = (int)(auVar39._0_4_ + auVar26._0_4_);
          auVar40._4_4_ = (int)(auVar39._4_4_ + auVar26._4_4_);
          auVar40._8_4_ = (int)(auVar39._8_4_ + auVar26._8_4_);
          auVar40._12_4_ = (int)(auVar39._12_4_ + auVar26._12_4_);
          auVar26 = vpackssdw_avx(auVar40,auVar40);
          auVar26 = vpminsw_avx(auVar26,auVar24);
          auVar26 = vpmaxsw_avx(auVar26,auVar25);
          auVar26 = vpacksswb_avx(auVar26,auVar26);
          *(int *)*pauVar16 = auVar26._0_4_;
          pauVar16 = (undefined1 (*) [16])(*pauVar16 + 4);
        }
      }
      lVar13 = lVar13 + lVar11;
      lVar18 = lVar18 + lVar11;
      lVar22 = lVar22 + lVar11;
    }
    auVar30._8_4_ = 0x80000000;
    auVar30._0_8_ = 0x8000000080000000;
    auVar30._12_4_ = 0x80000000;
    auVar41._8_4_ = 0x3effffff;
    auVar41._0_8_ = 0x3effffff3effffff;
    auVar41._12_4_ = 0x3effffff;
    for (; (long)(uVar15 | 1) < lVar8; uVar15 = uVar15 + 2) {
      pvVar2 = B->data;
      pfVar10 = (float *)((long)pvVar2 + lVar17 * 4 + (lVar14 + uVar15) * lVar6 * 4);
      pauVar23 = pauVar16;
      for (lVar22 = 0; (int)lVar22 + 3 < max_kk; lVar22 = lVar22 + 4) {
        auVar49._0_4_ = scale * *pfVar10;
        auVar49._4_4_ = scale * pfVar10[1];
        auVar49._8_4_ = scale * pfVar10[2];
        auVar49._12_4_ = scale * pfVar10[3];
        pfVar1 = (float *)((long)pvVar2 + lVar22 * 4 + lVar18);
        auVar56._0_4_ = scale * *pfVar1;
        auVar56._4_4_ = scale * pfVar1[1];
        auVar56._8_4_ = scale * pfVar1[2];
        auVar56._12_4_ = scale * pfVar1[3];
        auVar61 = vmovlhps_avx(auVar49,auVar56);
        auVar62 = vunpckhpd_avx(auVar49,auVar56);
        auVar26 = vandps_avx(auVar61,auVar27);
        auVar60 = vandps_avx(auVar62,auVar27);
        auVar26 = vorps_avx(auVar26,auVar28);
        auVar60 = vorps_avx(auVar60,auVar28);
        auVar57._0_4_ = (int)(auVar26._0_4_ + auVar61._0_4_);
        auVar57._4_4_ = (int)(auVar26._4_4_ + auVar61._4_4_);
        auVar57._8_4_ = (int)(auVar26._8_4_ + auVar61._8_4_);
        auVar57._12_4_ = (int)(auVar26._12_4_ + auVar61._12_4_);
        auVar50._0_4_ = (int)(auVar60._0_4_ + auVar62._0_4_);
        auVar50._4_4_ = (int)(auVar60._4_4_ + auVar62._4_4_);
        auVar50._8_4_ = (int)(auVar60._8_4_ + auVar62._8_4_);
        auVar50._12_4_ = (int)(auVar60._12_4_ + auVar62._12_4_);
        auVar26 = vpackssdw_avx(auVar57,auVar50);
        auVar26 = vpminsw_avx(auVar26,auVar24);
        auVar26 = vpmaxsw_avx(auVar26,auVar25);
        auVar26 = vpacksswb_avx(auVar26,auVar26);
        *(long *)*pauVar23 = auVar26._0_8_;
        pauVar23 = (undefined1 (*) [16])(*pauVar23 + 8);
        pfVar10 = pfVar10 + 4;
      }
      for (; (int)lVar22 + 1 < max_kk; lVar22 = lVar22 + 2) {
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)((long)pvVar2 + lVar22 * 4 + lVar18);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *(ulong *)((long)pvVar2 + lVar22 * 4 + lVar13);
        auVar26 = vmovlhps_avx(auVar58,auVar51);
        auVar52._0_4_ = scale * auVar26._0_4_;
        auVar52._4_4_ = scale * auVar26._4_4_;
        auVar52._8_4_ = scale * auVar26._8_4_;
        auVar52._12_4_ = scale * auVar26._12_4_;
        auVar26 = vandps_avx(auVar52,auVar27);
        auVar26 = vorps_avx(auVar26,auVar28);
        auVar53._0_4_ = (int)(auVar26._0_4_ + auVar52._0_4_);
        auVar53._4_4_ = (int)(auVar26._4_4_ + auVar52._4_4_);
        auVar53._8_4_ = (int)(auVar26._8_4_ + auVar52._8_4_);
        auVar53._12_4_ = (int)(auVar26._12_4_ + auVar52._12_4_);
        auVar26 = vpackssdw_avx(auVar53,auVar53);
        auVar26 = vpminsw_avx(auVar26,auVar24);
        auVar26 = vpmaxsw_avx(auVar26,auVar25);
        auVar26 = vpacksswb_avx(auVar26,auVar26);
        *(int *)(*pauVar16 + lVar22 * 2) = auVar26._0_4_;
        pauVar23 = (undefined1 (*) [16])(*pauVar23 + 4);
      }
      for (; pauVar16 = pauVar23, (int)lVar22 < max_kk; lVar22 = lVar22 + 1) {
        fVar73 = scale * *(float *)((long)pvVar2 + lVar22 * 4 + lVar13);
        auVar26 = vandps_avx(ZEXT416((uint)fVar73),auVar30);
        auVar26 = vorps_avx(auVar26,auVar41);
        auVar26 = ZEXT416((uint)(auVar26._0_4_ + fVar73));
        auVar26 = vroundss_avx(auVar26,auVar26,0xb);
        iVar5 = (int)auVar26._0_4_;
        if ((int)auVar26._0_4_ < -0x7e) {
          iVar5 = -0x7f;
        }
        if (0x7e < iVar5) {
          iVar5 = 0x7f;
        }
        (*pauVar16)[0] = (char)iVar5;
        fVar73 = scale * *(float *)((long)pvVar2 + lVar22 * 4 + lVar18);
        auVar26 = vandps_avx(ZEXT416((uint)fVar73),auVar30);
        auVar26 = vorps_avx(auVar26,auVar41);
        auVar26 = ZEXT416((uint)(auVar26._0_4_ + fVar73));
        auVar26 = vroundss_avx(auVar26,auVar26,0xb);
        iVar5 = (int)auVar26._0_4_;
        if ((int)auVar26._0_4_ < -0x7e) {
          iVar5 = -0x7f;
        }
        if (0x7e < iVar5) {
          iVar5 = 0x7f;
        }
        (*pauVar16)[1] = (char)iVar5;
        pauVar23 = (undefined1 (*) [16])(*pauVar16 + 2);
      }
      lVar13 = lVar13 + lVar6 * 8;
      lVar18 = lVar18 + lVar6 * 8;
    }
    auVar31._8_4_ = 0x3effffff;
    auVar31._0_8_ = 0x3effffff3effffff;
    auVar31._12_4_ = 0x3effffff;
    for (; (long)uVar15 < lVar8; uVar15 = uVar15 + 1) {
      pvVar2 = B->data;
      pfVar10 = (float *)((long)pvVar2 + lVar17 * 4 + (lVar14 + uVar15) * lVar6 * 4);
      for (lVar18 = 0; (int)lVar18 + 3 < max_kk; lVar18 = lVar18 + 4) {
        auVar42._0_4_ = scale * *pfVar10;
        auVar42._4_4_ = scale * pfVar10[1];
        auVar42._8_4_ = scale * pfVar10[2];
        auVar42._12_4_ = scale * pfVar10[3];
        auVar26 = vandps_avx(auVar42,auVar27);
        auVar26 = vorps_avx(auVar26,auVar28);
        auVar43._0_4_ = (int)(auVar42._0_4_ + auVar26._0_4_);
        auVar43._4_4_ = (int)(auVar42._4_4_ + auVar26._4_4_);
        auVar43._8_4_ = (int)(auVar42._8_4_ + auVar26._8_4_);
        auVar43._12_4_ = (int)(auVar42._12_4_ + auVar26._12_4_);
        auVar26 = vpackssdw_avx(auVar43,auVar43);
        auVar26 = vpminsw_avx(auVar26,auVar24);
        auVar26 = vpmaxsw_avx(auVar26,auVar25);
        auVar26 = vpacksswb_avx(auVar26,auVar26);
        *(int *)(*pauVar16 + lVar18) = auVar26._0_4_;
        pfVar10 = pfVar10 + 4;
      }
      for (; (int)lVar18 < max_kk; lVar18 = lVar18 + 1) {
        fVar73 = scale * *(float *)((long)pvVar2 + lVar18 * 4 + lVar13);
        auVar26 = vandps_avx(ZEXT416((uint)fVar73),auVar27);
        auVar26 = vorps_avx(auVar26,auVar31);
        auVar26 = ZEXT416((uint)(fVar73 + auVar26._0_4_));
        auVar26 = vroundss_avx(auVar26,auVar26,0xb);
        iVar5 = (int)auVar26._0_4_;
        if (iVar5 < -0x7e) {
          iVar5 = -0x7f;
        }
        if (0x7e < iVar5) {
          iVar5 = 0x7f;
        }
        (*pauVar16)[lVar18] = (char)iVar5;
      }
      lVar13 = lVar13 + lVar6 * 4;
      pauVar16 = (undefined1 (*) [16])(*pauVar16 + lVar18);
    }
    return;
  }
  pack_B_tile_fp32_to_int8_avxvnni(B,BT,j,max_jj,k,max_kk,scale);
  return;
}

Assistant:

void pack_B_tile_fp32_to_int8_avx2(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk, float scale)
{
    pack_B_tile_fp32_to_int8(B, BT, j, max_jj, k, max_kk, scale);
}